

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iothub_client_ll_uploadtoblob.c
# Opt level: O3

IOTHUB_CLIENT_RESULT
IoTHubClient_LL_UploadToBlob_PutBlock
          (IOTHUB_CLIENT_LL_UPLOADTOBLOB_CONTEXT_HANDLE uploadContext,uint32_t blockNumber,
          uint8_t *dataPtr,size_t dataSize)

{
  BLOB_RESULT BVar1;
  LOGGER_LOG p_Var2;
  BUFFER_HANDLE blockData;
  IOTHUB_CLIENT_RESULT IVar3;
  uint httpResponseStatus;
  
  if ((dataPtr == (uint8_t *)0x0 ||
      uploadContext == (IOTHUB_CLIENT_LL_UPLOADTOBLOB_CONTEXT_HANDLE)0x0) || dataSize == 0) {
    p_Var2 = xlogging_get_log_function();
    if (p_Var2 == (LOGGER_LOG)0x0) {
      IVar3 = IOTHUB_CLIENT_INVALID_ARG;
    }
    else {
      IVar3 = IOTHUB_CLIENT_INVALID_ARG;
      (*p_Var2)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothub_client_ll_uploadtoblob.c"
                ,"IoTHubClient_LL_UploadToBlob_PutBlock",0x3d8,1,
                "invalid argument uploadContext=%p, dataPtr=%p, dataSize=%zu",uploadContext,dataPtr,
                dataSize);
    }
  }
  else {
    blockData = BUFFER_create(dataPtr,dataSize);
    if (blockData == (BUFFER_HANDLE)0x0) {
      p_Var2 = xlogging_get_log_function();
      IVar3 = IOTHUB_CLIENT_ERROR;
      if (p_Var2 != (LOGGER_LOG)0x0) {
        (*p_Var2)(AZ_LOG_ERROR,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothub_client_ll_uploadtoblob.c"
                  ,"IoTHubClient_LL_UploadToBlob_PutBlock",0x3e1,1,
                  "Failed allocating buffer for Blob block data");
      }
    }
    else {
      BVar1 = Blob_PutBlock(uploadContext->blobHttpApiHandle,uploadContext->blobStorageRelativePath,
                            blockNumber,blockData,uploadContext->blockIdList,&httpResponseStatus,
                            (BUFFER_HANDLE)0x0);
      if (BVar1 == BLOB_OK) {
        IVar3 = IOTHUB_CLIENT_OK;
      }
      else {
        p_Var2 = xlogging_get_log_function();
        IVar3 = IOTHUB_CLIENT_ERROR;
        if (p_Var2 != (LOGGER_LOG)0x0) {
          (*p_Var2)(AZ_LOG_ERROR,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothub_client_ll_uploadtoblob.c"
                    ,"IoTHubClient_LL_UploadToBlob_PutBlock",0x3ef,1,
                    "Failed uploading Blob block data");
        }
      }
      BUFFER_delete(blockData);
    }
  }
  return IVar3;
}

Assistant:

IOTHUB_CLIENT_RESULT IoTHubClient_LL_UploadToBlob_PutBlock(IOTHUB_CLIENT_LL_UPLOADTOBLOB_CONTEXT_HANDLE uploadContext, uint32_t blockNumber, const uint8_t* dataPtr, size_t dataSize)
{
    IOTHUB_CLIENT_RESULT result;

    if (uploadContext == NULL || dataPtr == NULL || dataSize == 0)
    {
        LogError("invalid argument uploadContext=%p, dataPtr=%p, dataSize=%zu", uploadContext, dataPtr, dataSize);
        result = IOTHUB_CLIENT_INVALID_ARG;
    }
    else
    {
        BUFFER_HANDLE blockData;

        if ((blockData = BUFFER_create(dataPtr, dataSize)) == NULL)
        {
            LogError("Failed allocating buffer for Blob block data");
            result = IOTHUB_CLIENT_ERROR;
        }
        else
        {
            unsigned int httpResponseStatus;

            if (Blob_PutBlock(
                uploadContext->blobHttpApiHandle,
                uploadContext->blobStorageRelativePath,
                blockNumber, blockData,
                uploadContext->blockIdList,
                &httpResponseStatus, NULL) != BLOB_OK)
            {
                LogError("Failed uploading Blob block data");
                result = IOTHUB_CLIENT_ERROR;
            }
            else
            {
                result = IOTHUB_CLIENT_OK;
            }

            BUFFER_delete(blockData);
        }
    }

    return result;
}